

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopUtils::FullyUnroll(LoopUtils *this)

{
  IRContext *c;
  bool bVar1;
  BasicBlock *this_00;
  Function *function;
  undefined1 local_1e0 [8];
  LoopUnrollerUtilsImpl unroller;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  LoopUtils *this_local;
  
  bVar1 = CanPerformUnroll(this);
  if (bVar1) {
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&unroller.loop_init_value_);
    Loop::GetInductionVariables
              (this->loop_,
               (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&unroller.loop_init_value_);
    c = this->context_;
    this_00 = Loop::GetHeaderBlock(this->loop_);
    function = BasicBlock::GetParent(this_00);
    anon_unknown_0::LoopUnrollerUtilsImpl::LoopUnrollerUtilsImpl
              ((LoopUnrollerUtilsImpl *)local_1e0,c,function);
    anon_unknown_0::LoopUnrollerUtilsImpl::Init((LoopUnrollerUtilsImpl *)local_1e0,this->loop_);
    anon_unknown_0::LoopUnrollerUtilsImpl::FullyUnroll
              ((LoopUnrollerUtilsImpl *)local_1e0,this->loop_);
    anon_unknown_0::LoopUnrollerUtilsImpl::~LoopUnrollerUtilsImpl
              ((LoopUnrollerUtilsImpl *)local_1e0);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &unroller.loop_init_value_);
  }
  return bVar1;
}

Assistant:

bool LoopUtils::FullyUnroll() {
  if (!CanPerformUnroll()) return false;

  std::vector<Instruction*> inductions;
  loop_->GetInductionVariables(inductions);

  LoopUnrollerUtilsImpl unroller{context_,
                                 loop_->GetHeaderBlock()->GetParent()};

  unroller.Init(loop_);
  unroller.FullyUnroll(loop_);

  return true;
}